

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srtStreamReader.cpp
# Opt level: O0

uint8_t * __thiscall SRTStreamReader::renderNextMessage(SRTStreamReader *this,uint32_t *renderedLen)

{
  bool bVar1;
  bool bVar2;
  reference pcVar3;
  reference pvVar4;
  reference pvVar5;
  ostream *poVar6;
  char *pcVar7;
  VodCoreException *this_00;
  ulong uVar8;
  byte local_239;
  byte local_209;
  string local_1f8;
  ostringstream local_1c8 [8];
  ostringstream ss;
  char *c;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  SRTStreamReader *pSStack_28;
  bool isNUmber;
  uint8_t *rez;
  uint32_t *renderedLen_local;
  SRTStreamReader *this_local;
  
  pSStack_28 = (SRTStreamReader *)0x0;
  bVar1 = std::
          queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->m_sourceText);
  if (bVar1) {
    this_local = (SRTStreamReader *)0x0;
  }
  else {
    if (this->m_state == PARSE_FIRST_LINE) {
      while( true ) {
        bVar1 = std::
                queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty(&this->m_sourceText);
        local_209 = 0;
        if (!bVar1) {
          std::
          queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::front(&this->m_sourceText);
          local_209 = std::__cxx11::string::empty();
        }
        if ((local_209 & 1) == 0) break;
        std::
        queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pop(&this->m_sourceText);
        pvVar4 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front(&this->m_origSize);
        this->m_processedSize = *pvVar4 + this->m_processedSize;
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->m_origSize);
      }
      bVar1 = std::
              queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&this->m_sourceText);
      if (bVar1) {
        return (uint8_t *)0x0;
      }
      this->m_state = PARSE_TIME;
      bVar1 = true;
      std::
      queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::front(&this->m_sourceText);
      __end2._M_current = (char *)std::__cxx11::string::begin();
      c = (char *)std::__cxx11::string::end();
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&c), bVar2) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&__end2);
        if (((*pcVar3 < '0') || ('9' < *pcVar3)) && (*pcVar3 != ' ')) {
          bVar1 = false;
          break;
        }
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
      if (bVar1) {
        std::
        queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::pop(&this->m_sourceText);
        pvVar4 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front(&this->m_origSize);
        this->m_processedSize = *pvVar4 + this->m_processedSize;
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->m_origSize);
        bVar1 = std::
                queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty(&this->m_sourceText);
        if (bVar1) {
          return (uint8_t *)0x0;
        }
      }
    }
    if (this->m_state == PARSE_TIME) {
      pvVar5 = std::
               queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::front(&this->m_sourceText);
      bVar1 = parseTime(this,pvVar5);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_1c8);
        poVar6 = std::operator<<((ostream *)local_1c8,"Invalid SRT format. \"");
        std::
        queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::front(&this->m_sourceText);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        poVar6 = std::operator<<(poVar6,pcVar7);
        std::operator<<(poVar6,"\" is invalid timing info");
        this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(this_00,3,&local_1f8);
        __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      this->m_state = PARSE_TEXT;
      std::
      queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop(&this->m_sourceText);
      pvVar4 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front(&this->m_origSize);
      this->m_processedSize = *pvVar4 + this->m_processedSize;
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->m_origSize);
      bVar1 = std::
              queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&this->m_sourceText);
      if (bVar1) {
        return (uint8_t *)0x0;
      }
    }
    while( true ) {
      bVar1 = std::
              queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty(&this->m_sourceText);
      local_239 = 0;
      if (!bVar1) {
        std::
        queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::front(&this->m_sourceText);
        local_239 = std::__cxx11::string::empty();
        local_239 = local_239 ^ 0xff;
      }
      if ((local_239 & 1) == 0) break;
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)&this->m_renderedText,'\n');
      }
      pvVar5 = std::
               queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::front(&this->m_sourceText);
      std::__cxx11::string::operator+=((string *)&this->m_renderedText,(string *)pvVar5);
      std::
      queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop(&this->m_sourceText);
      pvVar4 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front(&this->m_origSize);
      this->m_processedSize = *pvVar4 + this->m_processedSize;
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->m_origSize);
    }
    bVar1 = std::
            queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(&this->m_sourceText);
    if (bVar1) {
      if (((this->m_lastBlock & 1U) != 0) &&
         (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) {
        this->m_state = PARSE_FIRST_LINE;
        std::__cxx11::string::clear();
        pSStack_28 = (SRTStreamReader *)
                     text_subtitles::TextToPGSConverter::doConvert
                               (this->m_srtRender,&this->m_renderedText,&this->m_animation,
                                this->m_inTime,this->m_outTime,renderedLen);
      }
      this_local = pSStack_28;
    }
    else {
      std::
      queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop(&this->m_sourceText);
      pvVar4 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front(&this->m_origSize);
      this->m_processedSize = *pvVar4 + this->m_processedSize;
      std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop(&this->m_origSize);
      this_local = (SRTStreamReader *)
                   text_subtitles::TextToPGSConverter::doConvert
                             (this->m_srtRender,&this->m_renderedText,&this->m_animation,
                              this->m_inTime,this->m_outTime,renderedLen);
      this->m_state = PARSE_FIRST_LINE;
      std::__cxx11::string::clear();
    }
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* SRTStreamReader::renderNextMessage(uint32_t& renderedLen)
{
    uint8_t* rez = nullptr;
    if (m_sourceText.empty())
        return nullptr;
    if (m_state == ParseState::PARSE_FIRST_LINE)
    {
        while (!m_sourceText.empty() && m_sourceText.front().empty())
        {
            m_sourceText.pop();  // delete empty lines before message
            m_processedSize += m_origSize.front();
            m_origSize.pop();
        }
        if (m_sourceText.empty())
            return nullptr;
        m_state = ParseState::PARSE_TIME;
        bool isNUmber = true;
        {
            for (const auto& c : m_sourceText.front())
                if (!(c >= '0' && c <= '9') && c != ' ')
                {
                    isNUmber = false;
                    break;
                }
        }
        if (isNUmber)
        {
            m_sourceText.pop();
            m_processedSize += m_origSize.front();
            m_origSize.pop();
            if (m_sourceText.empty())
                return nullptr;
        }
    }
    if (m_state == ParseState::PARSE_TIME)
    {
        if (!parseTime(m_sourceText.front()))
            THROW(ERR_COMMON, "Invalid SRT format. \"" << m_sourceText.front().c_str() << "\" is invalid timing info")
        m_state = ParseState::PARSE_TEXT;
        m_sourceText.pop();
        m_processedSize += m_origSize.front();
        m_origSize.pop();
        if (m_sourceText.empty())
            return nullptr;
    }

    while (!m_sourceText.empty() && !m_sourceText.front().empty())
    {
        if (!m_renderedText.empty())
            m_renderedText += '\n';
        m_renderedText += m_sourceText.front();
        m_sourceText.pop();
        m_processedSize += m_origSize.front();
        m_origSize.pop();
    }

    if (m_sourceText.empty())
    {
        if (m_lastBlock && !m_renderedText.empty())
        {
            m_state = ParseState::PARSE_FIRST_LINE;
            m_renderedText.clear();
            rez = m_srtRender->doConvert(m_renderedText, m_animation, m_inTime, m_outTime, renderedLen);
        }
        return rez;
    }
    m_sourceText.pop();  // delete empty line (messages separator)
    m_processedSize += m_origSize.front();
    m_origSize.pop();
    rez = m_srtRender->doConvert(m_renderedText, m_animation, m_inTime, m_outTime, renderedLen);
    m_state = ParseState::PARSE_FIRST_LINE;
    m_renderedText.clear();
    return rez;
}